

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O0

uint32_t load32(void *src)

{
  uint32_t w;
  void *src_local;
  
  return *src;
}

Assistant:

static FORCE_INLINE uint32_t load32(const void *src) {
#if defined(NATIVE_LITTLE_ENDIAN)
	uint32_t w;
	memcpy(&w, src, sizeof w);
	return w;
#else
	const uint8_t *p = (const uint8_t *)src;
	uint32_t w = *p++;
	w |= (uint32_t)(*p++) << 8;
	w |= (uint32_t)(*p++) << 16;
	w |= (uint32_t)(*p++) << 24;
	return w;
#endif
}